

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fIntegerStateQueryTests.cpp
# Opt level: O3

void __thiscall
deqp::gles3::Functional::IntegerStateQueryVerifiers::GetInteger64Verifier::verifyInteger
          (GetInteger64Verifier *this,TestContext *testCtx,GLenum name,GLint reference)

{
  ostringstream *this_00;
  bool bVar1;
  StateQueryMemoryWriteGuard<long> state;
  StateQueryMemoryWriteGuard<long> local_1b8;
  undefined1 local_198 [120];
  ios_base local_120 [264];
  
  local_1b8.m_postguard = -0x2121212121212122;
  local_1b8.m_preguard = -0x2121212121212122;
  local_1b8.m_value = -0x2121212121212122;
  glu::CallLogWrapper::glGetInteger64v
            (&(this->super_StateVerifier).super_CallLogWrapper,name,&local_1b8.m_value);
  bVar1 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<long>::verifyValidity
                    (&local_1b8,testCtx);
  if ((bVar1) && (local_1b8.m_value != reference)) {
    local_198._0_8_ = testCtx->m_log;
    this_00 = (ostringstream *)(local_198 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,"// ERROR: expected ",0x13);
    std::ostream::operator<<(this_00,reference);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"; got ",6);
    std::ostream::_M_insert<long>((long)this_00);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    std::ios_base::~ios_base(local_120);
    if (testCtx->m_testResult == QP_TEST_RESULT_PASS) {
      tcu::TestContext::setTestResult(testCtx,QP_TEST_RESULT_FAIL,"Got invalid integer value");
    }
  }
  return;
}

Assistant:

void GetInteger64Verifier::verifyInteger (tcu::TestContext& testCtx, GLenum name, GLint reference)
{
	using tcu::TestLog;

	StateQueryMemoryWriteGuard<GLint64> state;
	glGetInteger64v(name, &state);

	if (!state.verifyValidity(testCtx))
		return;

	if (state != GLint64(reference))
	{
		testCtx.getLog() << TestLog::Message << "// ERROR: expected " << reference << "; got " << state << TestLog::EndMessage;
		if (testCtx.getTestResult() == QP_TEST_RESULT_PASS)
			testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Got invalid integer value");
	}
}